

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

void lin_reg<float,float>
               (vector<float,_std::allocator<float>_> *x,vector<float,_std::allocator<float>_> *y,
               double *coeff,double *intercept,size_t start,size_t end)

{
  size_type sVar1;
  size_type sVar2;
  double dVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_120;
  float *local_118;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_110;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_108;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_100;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_f8;
  double v2;
  float *local_e0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_d8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_d0;
  double local_c8;
  double v1;
  float *local_b8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_b0;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_a8;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_a0;
  float *local_98;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_90;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_88;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_80;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  double local_70;
  double i01;
  double i11;
  double i00;
  double det;
  double m01;
  double m11;
  double m00;
  size_t end_local;
  size_t start_local;
  double *intercept_local;
  double *coeff_local;
  vector<float,_std::allocator<float>_> *y_local;
  vector<float,_std::allocator<float>_> *x_local;
  
  m00 = (double)end;
  end_local = start;
  start_local = (size_t)intercept;
  intercept_local = coeff;
  coeff_local = (double *)y;
  y_local = x;
  sVar1 = std::vector<float,_std::allocator<float>_>::size(y);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(y_local);
  dVar5 = m00;
  if (sVar1 != sVar2) {
    __assert_fail("y.size() == x.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                  ,0x2c,
                  "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
                 );
  }
  dVar3 = (double)std::vector<float,_std::allocator<float>_>::size(y_local);
  if ((ulong)dVar5 <= (ulong)dVar3) {
    lVar4 = (long)m00 - end_local;
    auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = 0x45300000;
    m11 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
    local_80._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_78 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+(&local_80,end_local);
    local_90._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_88 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+(&local_90,(difference_type)m00);
    local_a0._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_98 = (float *)__gnu_cxx::
                        __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                        operator+(&local_a0,end_local);
    m01 = std::
          inner_product<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    (local_78,local_88,
                     (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                     local_98,0.0);
    local_b0._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_a8 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+(&local_b0,end_local);
    v1 = (double)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_b8 = (float *)__gnu_cxx::
                        __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                        operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                   *)&v1,(difference_type)m00);
    det = std::
          accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                    (local_a8,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                               )local_b8,0.0);
    i00 = m11 * m01 + -(det * det);
    i11 = m01 / i00;
    i01 = m11 / i00;
    local_70 = -det / i00;
    local_d8._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)coeff_local);
    local_d0 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+(&local_d8,end_local);
    v2 = (double)std::vector<float,_std::allocator<float>_>::begin
                           ((vector<float,_std::allocator<float>_> *)coeff_local);
    local_e0 = (float *)__gnu_cxx::
                        __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                        operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                   *)&v2,(difference_type)m00);
    local_c8 = std::
               accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                         (local_d0,(__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                                    )local_e0,0.0);
    local_100._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_f8 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+(&local_100,end_local);
    local_110._M_current = (float *)std::vector<float,_std::allocator<float>_>::begin(y_local);
    local_108 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+(&local_110,(difference_type)m00);
    local_120._M_current =
         (float *)std::vector<float,_std::allocator<float>_>::begin
                            ((vector<float,_std::allocator<float>_> *)coeff_local);
    local_118 = (float *)__gnu_cxx::
                         __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                         operator+(&local_120,end_local);
    dVar5 = std::
            inner_product<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                      (local_f8,local_108,
                       (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                       local_118,0.0);
    *(double *)start_local = i11 * local_c8 + local_70 * dVar5;
    *intercept_local = local_70 * local_c8 + i01 * dVar5;
    return;
  }
  __assert_fail("start >= 0 && end <= x.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vrunge[P]slopeOP/src/linalg.h"
                ,0x2d,
                "void lin_reg(vector<T1> &, vector<T2> &, double *, double *, size_t, size_t) [T1 = float, T2 = float]"
               );
}

Assistant:

void lin_reg(vector<T1> &x, vector<T2> &y, double *coeff, double *intercept,
             size_t start, size_t end) {
  /* calculate LSLR on x,y from position start to end (excluded). */

  assert(y.size() == x.size());
  assert(start >= 0 && end <= x.size());

  double m00, m11, m01, det;
  double i00, i11, i01;

  m00 = end - start;
  m11 =
      inner_product(x.begin() + start, x.begin() + end, x.begin() + start, 0.0);
  m01 = accumulate(x.begin() + start, x.begin() + end, 0.0);

  det = (m00 * m11) - m01 * m01;

  i00 = m11 / det;
  i11 = m00 / det;
  i01 = -m01 / det;

  double v1 = accumulate(y.begin() + start, y.begin() + end, 0.0);
  double v2 =
      inner_product(x.begin() + start, x.begin() + end, y.begin() + start, 0.0);

  *intercept = i00 * v1 + i01 * v2;
  *coeff = i01 * v1 + i11 * v2;
}